

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_type.cc
# Opt level: O0

string * __thiscall Type::EvalByteOrder_abi_cxx11_(Type *this,Output *out_cc,Env *env)

{
  bool bVar1;
  Expr *pEVar2;
  Type *in_RSI;
  string *in_RDI;
  Env *in_stack_ffffffffffffff80;
  Output *in_stack_ffffffffffffff88;
  ID *in_stack_ffffffffffffff90;
  Output *in_stack_ffffffffffffff98;
  ID *in_stack_ffffffffffffffa0;
  Env *in_stack_ffffffffffffffa8;
  string *__s;
  allocator<char> local_35 [20];
  allocator<char> local_21 [33];
  
  __s = in_RDI;
  pEVar2 = attr_byteorder_expr(in_RSI);
  if ((pEVar2 != (Expr *)0x0) && (bVar1 = declared_as_type(in_RSI), !bVar1)) {
    pEVar2 = attr_byteorder_expr(in_RSI);
    global_env();
    Expr::EvalExpr(pEVar2,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RSI,
               (char *)__s,(allocator<char> *)in_RDI);
    std::allocator<char>::~allocator(local_21);
    return __s;
  }
  Env::Evaluate((Env *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90
               );
  Env::RValue(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RSI,(char *)__s
             ,(allocator<char> *)in_RDI);
  std::allocator<char>::~allocator(local_35);
  return __s;
}

Assistant:

string Type::EvalByteOrder(Output* out_cc, Env* env) const
	{
	// If &byteorder is specified for a field, rather
	// than a type declaration, we do not add a byteorder variable
	// to the class, but instead evaluate it directly.
	if ( attr_byteorder_expr() && ! declared_as_type() )
		return attr_byteorder_expr()->EvalExpr(out_cc, global_env());
	env->Evaluate(out_cc, byteorder_id);
	return env->RValue(byteorder_id);
	}